

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utglTF2ImportExport.cpp
# Opt level: O0

void __thiscall
utglTF2ImportExport_importglTF2PrimitiveModePoints_Test::
utglTF2ImportExport_importglTF2PrimitiveModePoints_Test
          (utglTF2ImportExport_importglTF2PrimitiveModePoints_Test *this)

{
  utglTF2ImportExport_importglTF2PrimitiveModePoints_Test *this_local;
  
  utglTF2ImportExport::utglTF2ImportExport(&this->super_utglTF2ImportExport);
  (this->super_utglTF2ImportExport).super_AbstractImportExportBase.super_Test._vptr_Test =
       (_func_int **)&PTR__utglTF2ImportExport_importglTF2PrimitiveModePoints_Test_01041b90;
  return;
}

Assistant:

TEST_F(utglTF2ImportExport, importglTF2PrimitiveModePoints) {
    Assimp::Importer importer;
    //Line loop
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_07.gltf", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);
    EXPECT_EQ(scene->mMeshes[0]->mNumVertices, 1024u);
    for (unsigned int i = 0; i < scene->mMeshes[0]->mNumFaces; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[i].mNumIndices, 1u);
        EXPECT_EQ(scene->mMeshes[0]->mFaces[i].mIndices[0], i);
    }
}